

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileSwitch.cpp
# Opt level: O0

void __thiscall TileSwitch::addUpdate(TileSwitch *this,bool isCosmetic,bool noAdjacentUpdates)

{
  byte in_DL;
  byte in_SIL;
  Tile *in_RDI;
  Tile *in_stack_00000010;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  unordered_set<Tile_*,_std::hash<Tile_*>,_std::equal_to<Tile_*>,_std::allocator<Tile_*>_>
  *in_stack_ffffffffffffffd0;
  
  Tile::getBoardPtr(in_RDI);
  std::unordered_set<Tile_*,_std::hash<Tile_*>,_std::equal_to<Tile_*>,_std::allocator<Tile_*>_>::
  insert(in_stack_ffffffffffffffd0,
         (value_type *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
  if ((in_SIL & 1) == 0) {
    Tile::getBoardPtr(in_RDI);
    std::
    unordered_set<TileSwitch_*,_std::hash<TileSwitch_*>,_std::equal_to<TileSwitch_*>,_std::allocator<TileSwitch_*>_>
    ::insert((unordered_set<TileSwitch_*,_std::hash<TileSwitch_*>,_std::equal_to<TileSwitch_*>,_std::allocator<TileSwitch_*>_>
              *)in_RDI,(value_type *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
    if ((in_DL & 1) == 0) {
      Tile::_updateAdjacentTiles(in_stack_00000010);
    }
  }
  return;
}

Assistant:

void TileSwitch::addUpdate(bool isCosmetic, bool noAdjacentUpdates) {
    getBoardPtr()->cosmeticUpdates.insert(this);
    if (!isCosmetic) {
        getBoardPtr()->switchUpdates.insert(this);
        if (!noAdjacentUpdates) {
            _updateAdjacentTiles();
        }
    }
}